

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O3

void GifWriteBit(GifBitStatus *stat,uint32_t bit)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  
  bVar3 = (byte)((bit & 1) << (stat->bitIndex & 0x1f)) | stat->byte;
  stat->byte = bVar3;
  bVar2 = stat->bitIndex + 1;
  stat->bitIndex = bVar2;
  if (7 < bVar2) {
    uVar1 = stat->chunkIndex;
    stat->chunkIndex = uVar1 + 1;
    stat->chunk[uVar1] = bVar3;
    stat->bitIndex = '\0';
    stat->byte = '\0';
  }
  return;
}

Assistant:

void GifWriteBit( GifBitStatus& stat, uint32_t bit )
{
    bit = bit & 1;
    bit = bit << stat.bitIndex;
    stat.byte |= bit;

    ++stat.bitIndex;
    if( stat.bitIndex > 7 )
    {
        // move the newly-finished byte to the chunk buffer
        stat.chunk[stat.chunkIndex++] = stat.byte;
        // and start a new byte
        stat.bitIndex = 0;
        stat.byte = 0;
    }
}